

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_short,_5,_10,_15,_3U>
tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
          (Float<unsigned_int,_8,_23,_127,_3U> *other)

{
  uint uVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fffffff) != 0x7f800000) {
    uVar7 = uVar1 & 0x7f800000;
    uVar4 = uVar1 & 0x7fffff;
    if (uVar7 == 0x7f800000 && uVar4 != 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)0x7fff;
    }
    uVar3 = (ushort)(uVar1 >> 0x10);
    if ((uVar1 & 0x7fffffff) == 0) {
      return (Float<unsigned_short,_5,_10,_15,_3U>)uVar3;
    }
    uVar8 = uVar4 + 0x800000;
    if (uVar7 == 0 && uVar4 != 0) {
      uVar8 = uVar4;
    }
    uVar9 = (ulong)uVar8;
    if (uVar7 != 0 || uVar4 == 0) {
      uVar4 = (uVar1 >> 0x17 & 0xff) - 0x7f;
    }
    else {
      lVar2 = 0x3f;
      if ((uVar8 & 0x7fffff) != 0) {
        for (; (uVar8 & 0x7fffff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar9 = uVar9 << (~(byte)lVar2 + 0x18 & 0x3f);
      uVar4 = ((uint)lVar2 ^ 0xffffffc0) - 0x55;
    }
    if ((int)uVar4 < -0xe) {
      if (uVar4 < 0xffffffe7) {
        return (Float<unsigned_short,_5,_10,_15,_3U>)(uVar3 & 0x8000);
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)
             (uVar3 & 0x8000 |
             (ushort)(~(-1L << (-(char)uVar4 - 2U & 0x3f)) + uVar9 +
                      (ulong)((uVar9 >> ((ulong)~uVar4 & 0x3f) & 1) != 0) >> ((byte)~uVar4 & 0x3f)))
      ;
    }
    uVar7 = ((uint)uVar9 & 0xff7fffff) + 0xfff + (uint)(((uint)uVar9 >> 0xd & 1) != 0);
    uVar8 = uVar7 & 0x800000;
    iVar6 = uVar4 + (uVar8 >> 0x17);
    if (iVar6 < 0x10) {
      uVar5 = 0;
      if (uVar8 == 0) {
        uVar5 = (ushort)(uVar7 >> 0xd);
      }
      return (Float<unsigned_short,_5,_10,_15,_3U>)
             (uVar5 | uVar3 & 0x8000 | (short)iVar6 * 0x400 + 0x3c00U);
    }
  }
  return (Float<unsigned_short,_5,_10,_15,_3U>)((ushort)(-1 < (int)uVar1) * -0x8000 - 0x400);
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}